

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void __thiscall CodeGenGenericContext::KillRegister(CodeGenGenericContext *this,x86Reg reg)

{
  if (this->genRegRead[reg] == false) {
    if (this->x86Base[this->genRegUpdate[reg]].name != o_none) {
      this->x86Base[this->genRegUpdate[reg]].name = o_none;
      this->optimizationCount = this->optimizationCount + 1;
    }
  }
  this->genReg[reg].type = argNone;
  return;
}

Assistant:

void CodeGenGenericContext::KillRegister(x86Reg reg)
{
	// Eliminate dead stores to the register
	if(!genRegRead[reg])
	{
		x86Instruction *curr = genRegUpdate[reg] + x86Base;

		if(curr->name != o_none)
		{
			curr->name = o_none;
			optimizationCount++;
		}
	}

	// Invalidate the register value
	genReg[reg].type = x86Argument::argNone;
}